

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v6::internal::bigint::assign(bigint *this,bigint *other)

{
  uint *puVar1;
  size_t sVar2;
  buffer<unsigned_int> *in_RSI;
  buffer<unsigned_int> *in_RDI;
  uint *data;
  size_t in_stack_ffffffffffffffc8;
  buffer<unsigned_int> *in_stack_ffffffffffffffd0;
  uint *__result;
  
  buffer<unsigned_int>::size(in_RSI);
  buffer<unsigned_int>::resize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  puVar1 = buffer<unsigned_int>::data(in_RSI);
  __result = puVar1;
  sVar2 = buffer<unsigned_int>::size(in_RSI);
  puVar1 = puVar1 + sVar2;
  buffer<unsigned_int>::data(in_RDI);
  std::copy<unsigned_int_const*,unsigned_int*>((uint *)in_RDI,puVar1,__result);
  *(undefined4 *)&in_RDI[5]._vptr_buffer = *(undefined4 *)&in_RSI[5]._vptr_buffer;
  return;
}

Assistant:

void assign(const bigint& other) {
    bigits_.resize(other.bigits_.size());
    auto data = other.bigits_.data();
    std::copy(data, data + other.bigits_.size(), bigits_.data());
    exp_ = other.exp_;
  }